

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.h
# Opt level: O2

char * __thiscall icu_63::UDataPathIterator::next(UDataPathIterator *this,UErrorCode *pErrorCode)

{
  CharString *this_00;
  uint uVar1;
  char *pcVar2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  size_t sVar6;
  __off_t __length;
  int iVar7;
  size_t sVar8;
  
  if (U_ZERO_ERROR < *pErrorCode) {
    return (char *)0x0;
  }
  this_00 = &this->pathBuffer;
  do {
    pcVar2 = this->nextPath;
    if (pcVar2 == (char *)0x0) {
      return (char *)0x0;
    }
    if (pcVar2 == (this->itemPath).buffer.ptr) {
      this->nextPath = this->path;
LAB_0010e7dc:
      sVar8 = strlen(pcVar2);
    }
    else {
      pcVar5 = strchr(pcVar2,0x3a);
      this->nextPath = pcVar5;
      if (pcVar5 == (char *)0x0) goto LAB_0010e7dc;
      sVar8 = (long)pcVar5 - (long)pcVar2;
      this->nextPath = pcVar5 + 1;
    }
    iVar7 = (int)sVar8;
    if (iVar7 != 0) {
      (this->pathBuffer).len = 0;
      *(this->pathBuffer).buffer.ptr = '\0';
      CharString::append(this_00,pcVar2,iVar7,pErrorCode);
      pcVar2 = (this->pathBuffer).buffer.ptr;
      pcVar5 = findBasename(pcVar2);
      if (((3 < iVar7) && (this->checkLastFour == '\x01')) &&
         (iVar3 = strncmp(pcVar2 + (iVar7 - 4),(this->suffix).ptr_,4), iVar3 == 0)) {
        uVar1 = this->basenameLen;
        iVar3 = strncmp(pcVar5,this->basename,(ulong)uVar1);
        if ((iVar3 == 0) && (sVar6 = strlen(pcVar5), sVar6 == uVar1 + 4)) goto LAB_0010e964;
      }
      if (pcVar2[(long)((sVar8 << 0x20) + -0x100000000) >> 0x20] != '/') {
        if ((3 < iVar7) && (iVar3 = strncmp(pcVar2 + (iVar7 - 4),".dat",4), iVar3 == 0))
        goto LAB_0010e8bc;
        iVar3 = (this->packageStub).len;
        if (((long)iVar3 != 0) &&
           ((iVar3 < iVar7 &&
            (iVar4 = strcmp(pcVar2 + (((long)(sVar8 << 0x20) >> 0x20) - (long)iVar3),
                            (this->packageStub).buffer.ptr), iVar4 == 0)))) {
          CharString::truncate(this_00,(char *)(ulong)(uint)(iVar7 - iVar3),__length);
        }
        CharString::append(this_00,'/',pErrorCode);
      }
      CharString::append(this_00,(this->packageStub).buffer.ptr + 1,(this->packageStub).len + -1,
                         pErrorCode);
      iVar7 = (this->suffix).length_;
      if (iVar7 != 0) {
        if (4 < iVar7) {
          CharString::ensureEndsWithFileSeparator(this_00,pErrorCode);
          iVar7 = (this->suffix).length_;
        }
        CharString::append(this_00,(this->suffix).ptr_,iVar7,pErrorCode);
      }
LAB_0010e964:
      return (this_00->buffer).ptr;
    }
LAB_0010e8bc:
    if (this->path == (char *)0x0) {
      return (char *)0x0;
    }
  } while( true );
}

Assistant:

static
    inline UBool U_FAILURE(UErrorCode code) { return (UBool)(code>U_ZERO_ERROR); }